

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageLoader::load_runtime_symtab_from_gsym(CVmImageLoader *this,ulong siz)

{
  byte *p;
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  ulong uVar4;
  CVmImageLoader *in_RDI;
  vm_val_t val;
  char *dat;
  tc_symtype_t sym_type;
  size_t dat_len;
  size_t sym_len;
  char *sym_name;
  ulong cnt;
  char buf [208];
  size_t TOK_SYM_MAX_LEN;
  undefined6 in_stack_fffffffffffffea8;
  ushort in_stack_fffffffffffffeae;
  ulong *in_stack_fffffffffffffeb0;
  CVmRuntimeSymbols *in_stack_fffffffffffffeb8;
  vm_datatype_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  anon_union_8_8_cb74652f_for_val in_stack_fffffffffffffed0;
  ulong local_f0;
  byte local_e8 [208];
  undefined8 local_18;
  
  local_18 = 0x50;
  if (in_RDI->runtime_symtab_ == (CVmRuntimeSymbols *)0x0) {
    in_stack_fffffffffffffeb8 = (CVmRuntimeSymbols *)operator_new(0x18);
    CVmRuntimeSymbols::CVmRuntimeSymbols(in_stack_fffffffffffffeb8);
    in_RDI->runtime_symtab_ = in_stack_fffffffffffffeb8;
  }
  read_data(in_RDI,(char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
            (ulong *)CONCAT26(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8));
  uVar3 = ::osrp4(local_e8);
  for (local_f0 = uVar3 & 0xffffffff; local_f0 != 0; local_f0 = local_f0 - 1) {
    read_data(in_RDI,(char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
              (ulong *)CONCAT26(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8));
    iVar1 = ::osrp2(local_e8);
    uVar4 = (ulong)iVar1;
    iVar1 = ::osrp2(local_e8 + 2);
    iVar2 = ::osrp2(local_e8 + 4);
    if (uVar4 < 0x51) {
      if ((long)iVar1 + uVar4 < 0xd1) {
        read_data(in_RDI,(char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
                  (ulong *)CONCAT26(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8));
      }
      else {
        read_data(in_RDI,(char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
                  (ulong *)CONCAT26(in_stack_fffffffffffffeae,in_stack_fffffffffffffea8));
        skip_data(in_RDI,(size_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
      p = local_e8 + uVar4;
      in_stack_fffffffffffffeb0 = (ulong *)(ulong)(iVar2 - 1);
      switch(in_stack_fffffffffffffeb0) {
      case (ulong *)0x0:
        uVar3 = ::osrp4(p);
        vm_val_t::set_fnptr((vm_val_t *)&stack0xfffffffffffffec8,(pool_ofs_t)uVar3);
        break;
      case (ulong *)0x1:
        uVar3 = ::osrp4(p);
        vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffec8,(vm_obj_id_t)uVar3);
        break;
      case (ulong *)0x2:
        iVar1 = ::osrp2(p);
        vm_val_t::set_propid((vm_val_t *)&stack0xfffffffffffffec8,(vm_prop_id_t)iVar1);
        break;
      default:
        vm_val_t::set_empty((vm_val_t *)&stack0xfffffffffffffec8);
        break;
      case (ulong *)0x5:
        iVar1 = ::osrp2(local_e8 + uVar4 + 2);
        in_stack_fffffffffffffeae = (ushort)iVar1;
        iVar1 = ::osrp2(p);
        vm_val_t::set_bifptr
                  ((vm_val_t *)&stack0xfffffffffffffec8,in_stack_fffffffffffffeae,(ushort)iVar1);
        break;
      case (ulong *)0x8:
        uVar3 = ::osrp4(local_e8 + uVar4 + 2);
        vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffec8,(vm_obj_id_t)uVar3);
        break;
      case (ulong *)0x9:
        uVar3 = ::osrp4(p);
        vm_val_t::set_enum((vm_val_t *)&stack0xfffffffffffffec8,(uint32_t)uVar3);
      }
      if (in_stack_fffffffffffffec8 != VM_EMPTY) {
        CVmRuntimeSymbols::add_sym
                  ((CVmRuntimeSymbols *)in_stack_fffffffffffffed0.native_desc,
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (size_t)in_RDI,(vm_val_t *)in_stack_fffffffffffffeb8);
      }
    }
    else {
      skip_data(in_RDI,(size_t)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

void CVmImageLoader::load_runtime_symtab_from_gsym(VMG_ ulong siz)
{
    const size_t TOK_SYM_MAX_LEN = 80;
    char buf[TOK_SYM_MAX_LEN + 128];
    ulong cnt;

    /* allocate the symbol table if we haven't already done so */
    if (runtime_symtab_ == 0)
        runtime_symtab_ = new CVmRuntimeSymbols();

    /* read the symbol count */
    read_data(buf, 4, &siz);
    cnt = t3rp4u(buf);

    /* read the symbols and populate the symbol table */
    for ( ; cnt != 0 ; --cnt)
    {
        char *sym_name;
        size_t sym_len;
        size_t dat_len;
        tc_symtype_t sym_type;
        char *dat;
        vm_val_t val;

        /* read the symbol's length, extra data length, and type code */
        read_data(buf, 6, &siz);
        sym_len = osrp2(buf);
        dat_len = osrp2(buf + 2);
        sym_type = (tc_symtype_t)osrp2(buf + 4);

        /* check the lengths to make sure they don't overflow our buffer */
        if (sym_len > TOK_SYM_MAX_LEN)
        {
            /* 
             *   this symbol name is too long - skip the symbol and its
             *   extra data entirely 
             */
            skip_data(sym_len + dat_len, &siz);

            /* go on to the next symbol */
            continue;
        }
        else if (dat_len + sym_len > sizeof(buf))
        {
            /* 
             *   The extra data block is too long for our fixed buffer.
             *   Truncate the extra data so that we don't overflow our
             *   buffer, but proceed anyway with the truncated extra data.
             *   Note that we won't lose any data we care about, since any
             *   extra data beyond our buffer size is additional future
             *   format data that we don't know how to handle anyway.  By
             *   design, we're allowed to skip extra data that we don't know
             *   how to read.  
             */
            read_data(buf, sizeof(buf), &siz);

            /* skip the remainder of the extra data */
            skip_data(sym_len + dat_len - sizeof(buf), &siz);
        }
        else
        {
            /* read the symbol's name and its type-specific data */
            read_data(buf, sym_len + dat_len, &siz);
        }

        /* the symbol name is at the start of the buffer */
        sym_name = buf;

        /* get the pointer to the extra data (it comes after the name) */
        dat = buf + sym_len;

        /* create the new symbol table entry, depending on its type */
        switch(sym_type)
        {
        case TC_SYM_FUNC:
            /* set up the function pointer value */
            val.set_fnptr(t3rp4u(dat));
            break;

        case TC_SYM_OBJ:
            /* set up the object value */
            val.set_obj(t3rp4u(dat));
            break;

        case TC_SYM_PROP:
            /* set up the property value */
            val.set_propid(osrp2(dat));

            /* check the 'dictionary property' flag */
            if (dat_len >= 3 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's a dictionary property
            }
            break;

        case TC_SYM_ENUM:
            /* set up the enum value */
            val.set_enum(t3rp4u(dat));

            /* check the 'enum token' flag */
            if (dat_len >= 5 && (dat[0] & 0x01) != 0)
            {
                // $$$ it's an 'enum token'
            }
            break;

        case TC_SYM_METACLASS:
            /* set up the metaclass object value */
            val.set_obj(t3rp4u(dat + 2));
            break;

        case TC_SYM_BIF:
            /* built-in function */
            val.set_bifptr(osrp2(dat + 2), osrp2(dat));
            break;

        default:
            /* 
             *   ignore other types; mark the value as 'empty' so we know we
             *   don't have anything to add to the table 
             */
            val.set_empty();
            break;
        }

        /* if we found a valid type, add it to the table */
        if (val.typ != VM_EMPTY)
            runtime_symtab_->add_sym(sym_name, sym_len, &val);
    }
}